

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O2

cse_abstract * __thiscall
factory_item<xray_re::cse_alife_zone_visual>::create
          (factory_item<xray_re::cse_alife_zone_visual> *this)

{
  cse_alife_zone_visual *this_00;
  
  this_00 = (cse_alife_zone_visual *)operator_new(0x1d0);
  xray_re::cse_alife_zone_visual::cse_alife_zone_visual(this_00);
  (this_00->super_cse_alife_anomalous_zone).super_cse_alife_custom_zone.
  super_cse_alife_space_restrictor.super_cse_alife_dynamic_object.super_cse_alife_object.
  super_cse_abstract.m_clsid.field_0 = (this->super_factory_item_base).m_clsid.field_0;
  return (cse_abstract *)this_00;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}